

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[23],unsigned_char&,char_const(&)[6],CylHead&>
          (exception *this,char (*args) [23],uchar *args_1,char (*args_2) [6],CylHead *args_3)

{
  CylHead *in_R9;
  string local_50;
  CylHead *local_30;
  CylHead *args_local_3;
  char (*args_local_2) [6];
  uchar *args_local_1;
  char (*args_local) [23];
  exception *this_local;
  
  local_30 = args_3;
  args_local_3 = (CylHead *)args_2;
  args_local_2 = (char (*) [6])args_1;
  args_local_1 = (uchar *)args;
  args_local = (char (*) [23])this;
  make_string<char_const(&)[23],unsigned_char&,char_const(&)[6],CylHead&>
            (&local_50,(util *)args,(char (*) [23])args_1,(uchar *)args_2,(char (*) [6])args_3,in_R9
            );
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}